

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitsproc.c
# Opt level: O2

procfits_t *
fitsproc(char *name,char *contact,int noverify,char *dateobs,char *telescop,char *instrume,
        char *detector,char *wavelnth)

{
  undefined4 uVar1;
  anon_union_8_4_d826882f_for_v aVar2;
  anon_union_8_4_d826882f_for_v aVar3;
  int iVar4;
  int iVar5;
  sfts_t *f;
  procfits_t *ppVar6;
  char *pcVar7;
  sfts_t *out;
  char *pcVar8;
  float *pfVar9;
  undefined8 uVar10;
  sfkey_t local_50;
  
  uVar10 = 0xdeadbeef;
  if (noverify == 0) {
    uVar10 = 0;
  }
  f = sfts_openro(name,uVar10);
  sfts_find_hdukey(f,"DATE-OBS");
  ppVar6 = (procfits_t *)g_malloc0(0x50);
  pcVar7 = (char *)g_strdup(name);
  ppVar6->name = pcVar7;
  if (dateobs == (char *)0x0) {
    pcVar7 = sfts_read_keystring(f,"DATE-OBS");
  }
  else {
    pcVar7 = (char *)g_strdup(dateobs);
  }
  ppVar6->dateobs = pcVar7;
  if (telescop == (char *)0x0) {
    pcVar7 = sfts_read_keystring0(f,"TELESCOP");
    ppVar6->telescop = pcVar7;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = sfts_read_keystring(f,"OBSRVTRY");
      goto LAB_0010bb02;
    }
  }
  else {
    pcVar7 = (char *)g_strdup(telescop);
LAB_0010bb02:
    ppVar6->telescop = pcVar7;
  }
  if (instrume == (char *)0x0) {
    pcVar7 = sfts_read_keystring(f,"INSTRUME");
  }
  else {
    pcVar7 = (char *)g_strdup(instrume);
  }
  ppVar6->instrume = pcVar7;
  if (detector == (char *)0x0) {
    pcVar8 = sfts_read_keystring0(f,"DETECTOR");
    ppVar6->detector = pcVar8;
    detector = pcVar7;
    if (pcVar8 == (char *)0x0) goto LAB_0010bb5b;
  }
  else {
LAB_0010bb5b:
    pcVar7 = (char *)g_strdup(detector);
    ppVar6->detector = pcVar7;
  }
  if (wavelnth == (char *)0x0) {
    pcVar7 = sfts_read_keystring(f,"WAVELNTH");
  }
  else {
    pcVar7 = (char *)g_strdup(wavelnth);
  }
  ppVar6->wavelnth = pcVar7;
  local_50.v.f = 0.0;
  local_50.c = (char *)0x0;
  local_50.k = "ZNAXIS1";
  local_50.t = 'I';
  local_50._9_7_ = 0;
  iVar4 = sfts_read_keymaybe(f,&local_50);
  aVar2 = local_50.v;
  local_50.k = "ZNAXIS2";
  local_50.t = 'I';
  iVar5 = sfts_read_keymaybe(f,&local_50);
  aVar3 = local_50.v;
  if ((iVar4 == 1) && (iVar5 == 1)) {
    local_50.k = "NAXIS1";
    local_50.t = 'I';
    sfts_read_key(f,&local_50);
    local_50.k = "NAXIS2";
    local_50.t = 'I';
    uVar1 = local_50.v.i._0_4_;
    sfts_read_key(f,&local_50);
    if (((int)aVar2.i != uVar1) || ((int)aVar3.i != local_50.v.i._0_4_)) {
      out = sfts_create((char *)0x0,(char *)0x0);
      sfts_copy_header(f,out);
      local_50.k = "NAXIS1";
      local_50.t = 'I';
      local_50.v = (anon_union_8_4_d826882f_for_v)(long)(int)aVar2.i;
      sfts_write_key(out,&local_50);
      local_50.k = "NAXIS2";
      local_50.t = 'I';
      local_50.v = (anon_union_8_4_d826882f_for_v)(long)(int)aVar3.i;
      sfts_write_key(out,&local_50);
      pcVar7 = swap_fits2hv(out,contact);
      pcVar8 = sfts_free(out);
      g_free(pcVar8);
      goto LAB_0010bcd8;
    }
  }
  pcVar7 = swap_fits2hv(f,contact);
LAB_0010bcd8:
  ppVar6->xml = pcVar7;
  pfVar9 = (float *)sfts_read_image(f,&ppVar6->w,&ppVar6->h,0x100);
  ppVar6->im = pfVar9;
  pcVar7 = sfts_free(f);
  g_free(pcVar7);
  return ppVar6;
}

Assistant:

procfits_t *fitsproc(const char *name, const char *contact, int noverify,
                     const char *dateobs, const char *telescop, const char *instrume,
                     const char *detector, const char *wavelnth) {
    sfts_t *f = sfts_openro(name, noverify ? SFTS_SUM_NOVERIFY : 0);

    sfts_find_hdukey(f, "DATE-OBS");

    procfits_t *p = (procfits_t *) g_malloc0(sizeof *p);
    p->name = g_strdup(name);
    p->dateobs = dateobs ? g_strdup(dateobs) : sfts_read_keystring(f, "DATE-OBS");

    if (telescop) {
        p->telescop = g_strdup(telescop);
    } else {
        p->telescop = sfts_read_keystring0(f, "TELESCOP");
        if (!p->telescop)
            p->telescop = sfts_read_keystring(f, "OBSRVTRY");
    }

    p->instrume = instrume ? g_strdup(instrume) : sfts_read_keystring(f, "INSTRUME");

    if (detector) {
        p->detector = g_strdup(detector);
    } else {
        p->detector = sfts_read_keystring0(f, "DETECTOR");
        if (!p->detector)
            p->detector = g_strdup(p->instrume);
    }

    p->wavelnth = wavelnth ? g_strdup(wavelnth) : sfts_read_keystring(f, "WAVELNTH");

    p->xml = process_header(f, contact);
    p->im = (float *) sfts_read_image(f, &(p->w), &(p->h), SFLOAT);

    g_free(sfts_free(f));

    return p;
}